

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O1

pair<const_void_*,_const_pybind11::detail::type_info_*>
pybind11::detail::
type_caster_base<anurbs::Curve<2L,_anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>_>_>::src_and_type
          (itype *src)

{
  _func_int **pp_Var1;
  int iVar2;
  type_info *ptVar3;
  type_info *rtti_type;
  _func_int *p_Var4;
  pair<const_void_*,_const_pybind11::detail::type_info_*> pVar5;
  type_index local_20;
  
  if (src == (itype *)0x0) {
    rtti_type = (type_info *)0x0;
    p_Var4 = (_func_int *)0x0;
  }
  else {
    pp_Var1 = (src->super_CurveBase<2L>)._vptr_CurveBase;
    rtti_type = (type_info *)pp_Var1[-1];
    p_Var4 = pp_Var1[-2] + (long)&(src->super_CurveBase<2L>)._vptr_CurveBase;
  }
  if (((rtti_type != (type_info *)0x0) &&
      (*(char **)(rtti_type + 8) != "N6anurbs5CurveILl2ENS_3RefINS_18NurbsCurveGeometryILl2EEEEEEE")
      ) && (iVar2 = strcmp("N6anurbs5CurveILl2ENS_3RefINS_18NurbsCurveGeometryILl2EEEEEEE",
                           *(char **)(rtti_type + 8)), iVar2 != 0)) {
    local_20._M_target = rtti_type;
    ptVar3 = get_type_info(&local_20,false);
    pVar5.second = ptVar3;
    pVar5.first = p_Var4;
    if (ptVar3 != (type_info *)0x0) {
      return pVar5;
    }
  }
  pVar5 = type_caster_generic::src_and_type
                    (src,(type_info *)
                         &anurbs::Curve<2l,anurbs::Ref<anurbs::NurbsCurveGeometry<2l>>>::typeinfo,
                     rtti_type);
  return pVar5;
}

Assistant:

static std::pair<const void *, const type_info *> src_and_type(const itype *src) {
        auto &cast_type = typeid(itype);
        const std::type_info *instance_type = nullptr;
        const void *vsrc = polymorphic_type_hook<itype>::get(src, instance_type);
        if (instance_type && !same_type(cast_type, *instance_type)) {
            // This is a base pointer to a derived type. If the derived type is registered
            // with pybind11, we want to make the full derived object available.
            // In the typical case where itype is polymorphic, we get the correct
            // derived pointer (which may be != base pointer) by a dynamic_cast to
            // most derived type. If itype is not polymorphic, we won't get here
            // except via a user-provided specialization of polymorphic_type_hook,
            // and the user has promised that no this-pointer adjustment is
            // required in that case, so it's OK to use static_cast.
            if (const auto *tpi = get_type_info(*instance_type))
                return {vsrc, tpi};
        }
        // Otherwise we have either a nullptr, an `itype` pointer, or an unknown derived pointer, so
        // don't do a cast
        return type_caster_generic::src_and_type(src, cast_type, instance_type);
    }